

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

bool bssl::dtls1_finish_message(SSL *ssl,CBB *cbb,Array<unsigned_char> *out_msg)

{
  bool bVar1;
  size_t sVar2;
  uchar *puVar3;
  uchar *puVar4;
  Array<unsigned_char> *out_msg_local;
  CBB *cbb_local;
  SSL *ssl_local;
  
  bVar1 = CBBFinishArray(cbb,out_msg);
  if ((bVar1) && (sVar2 = Array<unsigned_char>::size(out_msg), 0xb < sVar2)) {
    puVar3 = Array<unsigned_char>::data(out_msg);
    puVar4 = Array<unsigned_char>::data(out_msg);
    ::OPENSSL_memcpy(puVar3 + 1,puVar4 + 9,3);
    ssl_local._7_1_ = true;
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x234);
    ssl_local._7_1_ = false;
  }
  return ssl_local._7_1_;
}

Assistant:

bool dtls1_finish_message(const SSL *ssl, CBB *cbb, Array<uint8_t> *out_msg) {
  if (!CBBFinishArray(cbb, out_msg) ||
      out_msg->size() < DTLS1_HM_HEADER_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // Fix up the header. Copy the fragment length into the total message
  // length.
  OPENSSL_memcpy(out_msg->data() + 1,
                 out_msg->data() + DTLS1_HM_HEADER_LENGTH - 3, 3);
  return true;
}